

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O2

void test_sfd_accept_multi(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  undefined1 local_a8 [8];
  char buf_ [64];
  size_t local_60;
  size_t sz_;
  int fds1 [2];
  int fds2 [2];
  nng_listener l2;
  nng_listener l3;
  nng_listener l1;
  nng_socket s1;
  nng_socket s2;
  nng_socket s3;
  
  nVar1 = nng_socket_pair((int *)&sz_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x67,"%s: expected success, got %s (%d)","nng_socket_pair(fds1)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_socket_pair(fds1);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                           ,0x68,"%s: expected success, got %s (%d)","nng_socket_pair(fds2)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_pub0_open((nng_socket *)&l3);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                             ,0x69,"%s: expected success, got %s (%d)","nng_pub0_open(&s1)",pcVar3,
                             nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_sub0_open((nng_socket *)&l1);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                               ,0x6a,"%s: expected success, got %s (%d)","nng_sub0_open(&s2)",pcVar3
                               ,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_sub0_open(&s1);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                 ,0x6b,"%s: expected success, got %s (%d)","nng_sub0_open(&s3)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_ms((nng_socket)l3.id,"send-timeout",1000);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                   ,0x6c,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_socket_set_ms((nng_socket)l1.id,"recv-timeout",1000);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                     ,0x6d,"%s: expected success, got %s (%d)",
                                     "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_socket_set_ms(s1,"recv-timeout",1000);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                       ,0x6e,"%s: expected success, got %s (%d)",
                                       "nng_socket_set_ms(s3, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1
                                      );
                if (iVar2 != 0) {
                  nVar1 = nng_sub0_socket_subscribe((nng_socket)l1.id,(void *)0x0,0);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                         ,0x6f,"%s: expected success, got %s (%d)",
                                         "nng_sub0_socket_subscribe(s2, NULL, 0)",pcVar3,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_sub0_socket_subscribe(s1,(void *)0x0,0);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                           ,0x70,"%s: expected success, got %s (%d)",
                                           "nng_sub0_socket_subscribe(s3, NULL, 0)",pcVar3,nVar1);
                    if (iVar2 != 0) {
                      nVar1 = nng_listener_create(&l2,(nng_socket)l3.id,"socket://");
                      pcVar3 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                             ,0x72,"%s: expected success, got %s (%d)",
                                             "nng_listener_create(&l1, s1, \"socket://\")",pcVar3,
                                             nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nng_listener_create((nng_listener *)fds2,(nng_socket)l1.id,
                                                    "socket://");
                        pcVar3 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                               ,0x73,"%s: expected success, got %s (%d)",
                                               "nng_listener_create(&l2, s2, \"socket://\")",pcVar3,
                                               nVar1);
                        if (iVar2 != 0) {
                          nVar1 = nng_listener_create((nng_listener *)(fds2 + 1),s1,"socket://");
                          pcVar3 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                 ,0x74,"%s: expected success, got %s (%d)",
                                                 "nng_listener_create(&l3, s3, \"socket://\")",
                                                 pcVar3,nVar1);
                          if (iVar2 != 0) {
                            nVar1 = nng_listener_start(l2,0);
                            pcVar3 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x75,"%s: expected success, got %s (%d)",
                                                  "nng_listener_start(l1, 0)",pcVar3,nVar1);
                            if (iVar2 != 0) {
                              nVar1 = nng_listener_start((nng_listener)fds2[0],0);
                              pcVar3 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x76,"%s: expected success, got %s (%d)",
                                                  "nng_listener_start(l2, 0)",pcVar3,nVar1);
                              if (iVar2 != 0) {
                                nVar1 = nng_listener_start((nng_listener)fds2[1],0);
                                pcVar3 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x77,"%s: expected success, got %s (%d)",
                                                  "nng_listener_start(l3, 0)",pcVar3,nVar1);
                                if (iVar2 != 0) {
                                  nVar1 = nng_listener_set_int(l2,"socket:fd",(int)sz_);
                                  pcVar3 = nng_strerror(nVar1);
                                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x78,"%s: expected success, got %s (%d)",
                                                  "nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds1[0])"
                                                  ,pcVar3,nVar1);
                                  if (iVar2 != 0) {
                                    nVar1 = nng_listener_set_int
                                                      ((nng_listener)fds2[0],"socket:fd",sz_._4_4_);
                                    pcVar3 = nng_strerror(nVar1);
                                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x79,"%s: expected success, got %s (%d)",
                                                  "nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds1[1])"
                                                  ,pcVar3,nVar1);
                                    if (iVar2 != 0) {
                                      nVar1 = nng_listener_set_int(l2,"socket:fd",fds1[0]);
                                      pcVar3 = nng_strerror(nVar1);
                                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7a,"%s: expected success, got %s (%d)",
                                                  "nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds2[0])"
                                                  ,pcVar3,nVar1);
                                      if (iVar2 != 0) {
                                        nVar1 = nng_listener_set_int
                                                          ((nng_listener)fds2[1],"socket:fd",fds1[1]
                                                          );
                                        pcVar3 = nng_strerror(nVar1);
                                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7b,"%s: expected success, got %s (%d)",
                                                  "nng_listener_set_int(l3, NNG_OPT_SOCKET_FD, fds2[1])"
                                                  ,pcVar3,nVar1);
                                        if (iVar2 != 0) {
                                          nng_msleep(200);
                                          nVar1 = nng_send((nng_socket)l3.id,"ping",5,0);
                                          pcVar3 = nng_strerror(nVar1);
                                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7d,"%s: expected success, got %s (%d)",
                                                  "nng_send(s1, \"ping\", strlen(\"ping\") + 1, 0)",
                                                  pcVar3,nVar1);
                                          if (iVar2 != 0) {
                                            local_60 = 0x40;
                                            num = nng_recv((nng_socket)l1.id,local_a8,&local_60,0);
                                            pcVar3 = nng_strerror(num);
                                            acutest_check_((uint)(num == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7e,"nng_recv (%d %s)",(ulong)num,pcVar3,nVar1);
                                            acutest_check_((uint)(local_60 == 5),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7e,"length %d want %d",local_60,5);
                                            buf_[0x37] = '\0';
                                            iVar2 = bcmp("ping",local_a8,5);
                                            acutest_check_((uint)(iVar2 == 0),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7e,"%s == %s","ping",local_a8);
                                            local_60 = 0x40;
                                            nVar1 = nng_recv(s1,local_a8,&local_60,0);
                                            pcVar3 = nng_strerror(nVar1);
                                            acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7f,"nng_recv (%d %s)",(ulong)nVar1,pcVar3);
                                            acutest_check_((uint)(local_60 == 5),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7f,"length %d want %d",local_60,5);
                                            buf_[0x37] = '\0';
                                            iVar2 = bcmp("ping",local_a8,5);
                                            acutest_check_((uint)(iVar2 == 0),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x7f,"%s == %s","ping",local_a8);
                                            nVar1 = nng_socket_close((nng_socket)l3.id);
                                            pcVar3 = nng_strerror(nVar1);
                                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x80,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s1)",pcVar3,nVar1);
                                            if (iVar2 != 0) {
                                              nVar1 = nng_socket_close((nng_socket)l1.id);
                                              pcVar3 = nng_strerror(nVar1);
                                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x81,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s2)",pcVar3,nVar1);
                                              if (iVar2 != 0) {
                                                nVar1 = nng_socket_close(s1);
                                                pcVar3 = nng_strerror(nVar1);
                                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                  ,0x82,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s3)",pcVar3,nVar1);
                                                if (iVar2 != 0) {
                                                  return;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_sfd_accept_multi(void)
{
#ifdef NNG_HAVE_SOCKETPAIR
	nng_socket   s1, s2, s3;
	nng_listener l1, l2, l3;
	int          fds1[2];
	int          fds2[2];

	NUTS_PASS(nng_socket_pair(fds1));
	NUTS_PASS(nng_socket_pair(fds2));
	NUTS_PASS(nng_pub0_open(&s1));
	NUTS_PASS(nng_sub0_open(&s2));
	NUTS_PASS(nng_sub0_open(&s3));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(s3, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_sub0_socket_subscribe(s2, NULL, 0));
	NUTS_PASS(nng_sub0_socket_subscribe(s3, NULL, 0));

	NUTS_PASS(nng_listener_create(&l1, s1, "socket://"));
	NUTS_PASS(nng_listener_create(&l2, s2, "socket://"));
	NUTS_PASS(nng_listener_create(&l3, s3, "socket://"));
	NUTS_PASS(nng_listener_start(l1, 0));
	NUTS_PASS(nng_listener_start(l2, 0));
	NUTS_PASS(nng_listener_start(l3, 0));
	NUTS_PASS(nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds1[0]));
	NUTS_PASS(nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds1[1]));
	NUTS_PASS(nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds2[0]));
	NUTS_PASS(nng_listener_set_int(l3, NNG_OPT_SOCKET_FD, fds2[1]));
	nng_msleep(200);
	NUTS_SEND(s1, "ping");
	NUTS_RECV(s2, "ping");
	NUTS_RECV(s3, "ping");
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	NUTS_CLOSE(s3);
#else
	NUTS_SKIP("no socketpair");
#endif
}